

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uic.cpp
# Opt level: O3

ssize_t __thiscall Uic::write(Uic *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  DomUI *other;
  ulong uVar2;
  Driver *__n_00;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t __n_01;
  void *__n_02;
  void *pvVar3;
  QArrayData **ppQVar4;
  QArrayData *pQVar5;
  QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_> QVar6;
  long in_FS_OFFSET;
  double dVar7;
  QLatin1String QVar8;
  QXmlStreamReader reader;
  QArrayData *local_48;
  char16_t *local_40;
  long local_38;
  QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d = (DomUI *)0x0;
  local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  QXmlStreamReader::QXmlStreamReader((QXmlStreamReader *)&local_48);
  QXmlStreamReader::setDevice((QIODevice *)&local_48);
  other = parseUiFile((QXmlStreamReader *)&local_48);
  QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_>::reset(&local_30,other);
  QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&local_48);
  if (local_30.d == (DomUI *)0x0) {
    uVar2 = 0;
  }
  else {
    local_48 = &(((local_30.d)->m_attr_version).d.d)->super_QArrayData;
    local_40 = ((local_30.d)->m_attr_version).d.ptr;
    local_38 = ((local_30.d)->m_attr_version).d.size;
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    ppQVar4 = &local_48;
    pvVar3 = (void *)0x0;
    dVar7 = (double)QString::toDouble((bool *)ppQVar4);
    iVar1 = (int)ppQVar4;
    __n_01 = extraout_RDX;
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pvVar3 = (void *)0x2;
        pQVar5 = local_48;
        QArrayData::deallocate(local_48,2,0x10);
        iVar1 = (int)pQVar5;
        __n_01 = extraout_RDX_00;
      }
    }
    if (dVar7 < 4.0) {
      write(iVar1,pvVar3,__n_01);
      uVar2 = 0;
    }
    else {
      local_48 = &(((local_30.d)->m_attr_language).d.d)->super_QArrayData;
      local_40 = ((local_30.d)->m_attr_language).d.ptr;
      local_38 = ((local_30.d)->m_attr_language).d.size;
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      __n_00 = this->drv;
      pvVar3 = (void *)CONCAT71((int7)(__n_01 >> 8),(local_30.d)->m_attr_idbasedtr);
      __n_00->m_idBasedTranslations = (local_30.d)->m_attr_idbasedtr;
      if (local_38 == 0) {
LAB_00175f84:
        uVar2 = write(this,(int)local_30.d,pvVar3,(size_t)__n_00);
        uVar2 = uVar2 & 0xffffffff;
      }
      else {
        __n_00 = (Driver *)0x0;
        QVar8.m_data = (char *)0x3;
        QVar8.m_size = (qsizetype)&local_48;
        iVar1 = QString::compare(QVar8,0x17f53a);
        pvVar3 = __n_02;
        if (iVar1 == 0) goto LAB_00175f84;
        write((int)&local_40,&local_38,(size_t)__n_02);
        uVar2 = 0;
      }
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,0x10);
        }
      }
    }
    QVar6.d = local_30.d;
    if (local_30.d != (DomUI *)0x0) {
      DomUI::~DomUI(local_30.d);
      goto LAB_00175fca;
    }
  }
  QVar6.d = (DomUI *)0x0;
LAB_00175fca:
  operator_delete(QVar6.d,0x148);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return uVar2;
}

Assistant:

bool Uic::write(QIODevice *in)
{
    QScopedPointer<DomUI> ui;
    {
        QXmlStreamReader reader;
        reader.setDevice(in);
        ui.reset(parseUiFile(reader));
    }

    if (ui.isNull())
        return false;

    double version = ui->attributeVersion().toDouble();
    if (version < 4.0) {
        fprintf(stderr, "uic: File generated with too old version of Qt Widgets Designer\n");
        return false;
    }

    const QString &language = ui->attributeLanguage();
    driver()->setUseIdBasedTranslations(ui->attributeIdbasedtr());

    if (!language.isEmpty() && language.compare("c++"_L1, Qt::CaseInsensitive) != 0) {
        fprintf(stderr, "uic: File is not a \"c++\" ui file, language=%s\n", qPrintable(language));
        return false;
    }

    return write(ui.data());
}